

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Log
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this,string *msg)

{
  long lVar1;
  bool bVar2;
  Level level;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *pTVar3;
  LogFlags flag;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int iStack_40;
  string full_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = this;
  LogMsg(&full_msg,this,msg);
  if (this->m_log_category == ALL) {
    level = Info;
    flag = ALL;
    iStack_40 = 0x38;
  }
  else {
    bVar2 = ::LogAcceptCategory(this->m_log_category,(Level)pTVar3);
    if (!bVar2) goto LAB_002a1310;
    flag = this->m_log_category;
    level = Debug;
    iStack_40 = 0x3a;
  }
  logging_function._M_str = "Log";
  logging_function._M_len = 3;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging/timer.h"
  ;
  source_file._M_len = 0x5f;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,iStack_40,flag,level,(ConstevalFormatString<1U>)0x723afd,
             &full_msg);
LAB_002a1310:
  std::__cxx11::string::~string((string *)&full_msg);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Log(const std::string& msg)
    {
        const std::string full_msg = this->LogMsg(msg);

        if (m_log_category == BCLog::LogFlags::ALL) {
            LogPrintf("%s\n", full_msg);
        } else {
            LogDebug(m_log_category, "%s\n", full_msg);
        }
    }